

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTimeDatatypeValidator.cpp
# Opt level: O0

XMLDateTime * __thiscall
xercesc_4_0::DateTimeDatatypeValidator::parse
          (DateTimeDatatypeValidator *this,XMLCh *content,MemoryManager *manager)

{
  XMLDateTime *pXVar1;
  OutOfMemoryException *anon_var_0;
  Janitor<xercesc_4_0::XMLDateTime> jan;
  XMLDateTime *pRetDate;
  MemoryManager *manager_local;
  XMLCh *content_local;
  DateTimeDatatypeValidator *this_local;
  
  pXVar1 = (XMLDateTime *)XMemory::operator_new(0x68,manager);
  XMLDateTime::XMLDateTime(pXVar1,content,manager);
  Janitor<xercesc_4_0::XMLDateTime>::Janitor
            ((Janitor<xercesc_4_0::XMLDateTime> *)&anon_var_0,pXVar1);
  XMLDateTime::parseDateTime(pXVar1);
  pXVar1 = Janitor<xercesc_4_0::XMLDateTime>::release
                     ((Janitor<xercesc_4_0::XMLDateTime> *)&anon_var_0);
  Janitor<xercesc_4_0::XMLDateTime>::~Janitor((Janitor<xercesc_4_0::XMLDateTime> *)&anon_var_0);
  return pXVar1;
}

Assistant:

XMLDateTime* DateTimeDatatypeValidator::parse(const XMLCh* const content, MemoryManager* const manager)
{
    XMLDateTime *pRetDate = new (manager) XMLDateTime(content, manager);
    Janitor<XMLDateTime> jan(pRetDate);

    try
    {
        pRetDate->parseDateTime();
    }
    catch(const OutOfMemoryException&)
    {
        jan.release();

        throw;
    }

    return jan.release();
}